

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

uint * __thiscall
pstack::ReaderArray<unsigned_int,_131072UL>::getitem
          (ReaderArray<unsigned_int,_131072UL> *this,size_t idx)

{
  Reader *pRVar1;
  size_t sVar2;
  pointer pvVar3;
  Exception *this_00;
  Exception *rhs;
  reference pvVar4;
  bool bVar5;
  Exception local_1c0;
  ulong local_20;
  size_t rc;
  size_t idx_local;
  ReaderArray<unsigned_int,_131072UL> *this_local;
  
  bVar5 = true;
  if (this->cacheStart <= idx) {
    bVar5 = this->cacheEnd <= idx;
  }
  rc = idx;
  idx_local = (size_t)this;
  if (bVar5) {
    pRVar1 = this->reader;
    sVar2 = this->base;
    pvVar3 = std::array<unsigned_int,_131072UL>::data(&this->cache);
    local_20 = (**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,idx * 4 + sVar2,0x80000,pvVar3);
    this->cacheStart = rc;
    this->cacheEnd = this->cacheStart + (local_20 >> 2);
    if (local_20 < 4) {
      this_00 = (Exception *)__cxa_allocate_exception();
      memset(&local_1c0,0,0x1a0);
      Exception::Exception(&local_1c0);
      rhs = Exception::operator<<(&local_1c0,(char (*) [32])"end of data while reading array");
      Exception::Exception(this_00,rhs);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
  }
  pvVar4 = std::array<unsigned_int,_131072UL>::operator[](&this->cache,rc - this->cacheStart);
  return pvVar4;
}

Assistant:

const T &ReaderArray<T, cachesize>::getitem(size_t idx) const {
   if (unlikely(cacheStart > idx || idx >= cacheEnd)) {
      size_t rc = reader.read(idx * sizeof(T) + base, cachesize * sizeof (T), reinterpret_cast<char *>(cache.data()));
      cacheStart = idx;
      cacheEnd = cacheStart + rc / sizeof(T);
      if (unlikely(rc < sizeof(T))) { // short read - consider this EOF.
         throw ( Exception() << "end of data while reading array" );
      }
   }
   return cache[idx - cacheStart];
}